

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gss.c
# Opt level: O0

void ssh_gss_cleanup(ssh_gss_liblist *list)

{
  int local_14;
  int i;
  ssh_gss_liblist *list_local;
  
  for (local_14 = 0; local_14 < list->nlibraries; local_14 = local_14 + 1) {
    dlclose(list->libraries[local_14].handle);
    if (list->libraries[local_14].id == 3) {
      safefree(list->libraries[local_14].gsslogmsg);
    }
  }
  safefree(list->libraries);
  safefree(list);
  return;
}

Assistant:

void ssh_gss_cleanup(struct ssh_gss_liblist *list)
{
    int i;

    /*
     * dlopen and dlclose are defined to employ reference counting
     * in the case where the same library is repeatedly dlopened, so
     * even in a multiple-sessions-per-process context it's safe to
     * naively dlclose everything here without worrying about
     * destroying it under the feet of another SSH instance still
     * using it.
     */
    for (i = 0; i < list->nlibraries; i++) {
        dlclose(list->libraries[i].handle);
        if (list->libraries[i].id == 3) {
            /* The 'custom' id involves a dynamically allocated message.
             * Note that we must cast away the 'const' to free it. */
            sfree((char *)list->libraries[i].gsslogmsg);
        }
    }
    sfree(list->libraries);
    sfree(list);
}